

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

InterfaceSchema __thiscall
capnp::InterfaceSchema::SuperclassList::operator[](SuperclassList *this,uint index)

{
  InterfaceSchema IVar1;
  uint64_t id;
  Reader superclass;
  Schema local_50;
  StructReader local_48;
  
  _::ListReader::getStructElement(&local_48,&(this->list).reader,index);
  if (local_48.dataSize < 0x40) {
    id = 0;
  }
  else {
    id = *local_48.data;
  }
  local_50 = Schema::getDependency((Schema *)this,id,index | 0x4000000);
  IVar1 = Schema::asInterface(&local_50);
  return (InterfaceSchema)IVar1.super_Schema.raw;
}

Assistant:

InterfaceSchema InterfaceSchema::SuperclassList::operator[](uint index) const {
  auto superclass = list[index];
  uint location = _::RawBrandedSchema::makeDepLocation(
      _::RawBrandedSchema::DepKind::SUPERCLASS, index);
  return parent.getDependency(superclass.getId(), location).asInterface();
}